

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingTest.cpp
# Opt level: O3

int main(void)

{
  type_test();
  sleep(3);
  stressing_single_thread();
  sleep(3);
  stressing_multi_threads(4);
  sleep(3);
  return 0;
}

Assistant:

int main(){
    // 共500014行 
    type_test();
    sleep(3);

    stressing_single_thread();
    sleep(3);

    stressing_multi_threads();
    sleep(3);
        
    return 0;
}